

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O1

lzma_ret lzma_lzma_encoder_create
                   (void **coder_ptr,lzma_allocator *allocator,lzma_options_lzma *options,
                   lzma_lz_options_conflict *lz_options)

{
  lzma_lzma1_encoder *coder;
  uint8_t *puVar1;
  byte bVar2;
  lzma_ret lVar3;
  void *pvVar4;
  byte bVar5;
  uint32_t uVar6;
  _Bool _Var7;
  
  if (*coder_ptr == (void *)0x0) {
    pvVar4 = lzma_alloc(0x3cee8,allocator);
    *coder_ptr = pvVar4;
    if (pvVar4 == (void *)0x0) {
      return LZMA_MEM_ERROR;
    }
  }
  coder = (lzma_lzma1_encoder *)*coder_ptr;
  if (options->mode == LZMA_MODE_NORMAL) {
    coder->fast_mode = false;
    bVar5 = 0;
    uVar6 = 0xfffffffe;
    do {
      bVar2 = bVar5 & 0x1f;
      bVar5 = bVar5 + 1;
      uVar6 = uVar6 + 2;
    } while ((uint)(1 << bVar2) < options->dict_size);
    coder->dist_table_size = uVar6;
    uVar6 = options->nice_len - 1;
    (coder->match_len_encoder).table_size = uVar6;
    (coder->rep_len_encoder).table_size = uVar6;
  }
  else {
    if (options->mode != LZMA_MODE_FAST) {
      return LZMA_OPTIONS_ERROR;
    }
    coder->fast_mode = true;
  }
  puVar1 = options->preset_dict;
  if (puVar1 == (uint8_t *)0x0) {
    _Var7 = false;
  }
  else {
    _Var7 = options->preset_dict_size != 0;
  }
  coder->is_initialized = _Var7;
  coder->is_flushed = false;
  lz_options->before_size = 0x1000;
  lz_options->dict_size = (ulong)options->dict_size;
  lz_options->after_size = 0x1001;
  lz_options->match_len_max = 0x111;
  lz_options->nice_len = (ulong)options->nice_len;
  lz_options->match_finder = options->mf;
  lz_options->depth = options->depth;
  lz_options->preset_dict = puVar1;
  lz_options->preset_dict_size = options->preset_dict_size;
  lVar3 = lzma_lzma_encoder_reset(coder,options);
  return lVar3;
}

Assistant:

extern lzma_ret
lzma_lzma_encoder_create(void **coder_ptr,
		const lzma_allocator *allocator,
		const lzma_options_lzma *options, lzma_lz_options *lz_options)
{
	// Allocate lzma_lzma1_encoder if it wasn't already allocated.
	if (*coder_ptr == NULL) {
		*coder_ptr = lzma_alloc(sizeof(lzma_lzma1_encoder), allocator);
		if (*coder_ptr == NULL)
			return LZMA_MEM_ERROR;
	}

	lzma_lzma1_encoder *coder = *coder_ptr;

	// Set compression mode. We haven't validates the options yet,
	// but it's OK here, since nothing bad happens with invalid
	// options in the code below, and they will get rejected by
	// lzma_lzma_encoder_reset() call at the end of this function.
	switch (options->mode) {
		case LZMA_MODE_FAST:
			coder->fast_mode = true;
			break;

		case LZMA_MODE_NORMAL: {
			coder->fast_mode = false;

			// Set dist_table_size.
			// Round the dictionary size up to next 2^n.
			uint32_t log_size = 0;
			while ((UINT32_C(1) << log_size) < options->dict_size)
				++log_size;

			coder->dist_table_size = log_size * 2;

			// Length encoders' price table size
			coder->match_len_encoder.table_size
				= options->nice_len + 1 - MATCH_LEN_MIN;
			coder->rep_len_encoder.table_size
				= options->nice_len + 1 - MATCH_LEN_MIN;
			break;
		}

		default:
			return LZMA_OPTIONS_ERROR;
	}

	// We don't need to write the first byte as literal if there is
	// a non-empty preset dictionary. encode_init() wouldn't even work
	// if there is a non-empty preset dictionary, because encode_init()
	// assumes that position is zero and previous byte is also zero.
	coder->is_initialized = options->preset_dict != NULL
			&& options->preset_dict_size > 0;
	coder->is_flushed = false;

	set_lz_options(lz_options, options);

	return lzma_lzma_encoder_reset(coder, options);
}